

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

uint64_t __thiscall mkvmuxer::MasteringMetadata::PayloadSize(MasteringMetadata *this)

{
  float fVar1;
  uint64 uVar2;
  uint64 uVar3;
  uint64_t uVar4;
  
  fVar1 = this->luminance_max_;
  if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
    uVar2 = EbmlElementSize(0x55d9,fVar1);
  }
  else {
    uVar2 = 0;
  }
  fVar1 = this->luminance_min_;
  if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
    uVar3 = EbmlElementSize(0x55da,fVar1);
    uVar2 = uVar2 + uVar3;
  }
  if (this->r_ != (PrimaryChromaticity *)0x0) {
    uVar4 = PrimaryChromaticity::PrimaryChromaticitySize
                      (this->r_,kMkvPrimaryRChromaticityX,kMkvPrimaryRChromaticityY);
    uVar2 = uVar2 + uVar4;
  }
  if (this->g_ != (PrimaryChromaticity *)0x0) {
    uVar4 = PrimaryChromaticity::PrimaryChromaticitySize
                      (this->g_,kMkvPrimaryGChromaticityX,kMkvPrimaryGChromaticityY);
    uVar2 = uVar2 + uVar4;
  }
  if (this->b_ != (PrimaryChromaticity *)0x0) {
    uVar4 = PrimaryChromaticity::PrimaryChromaticitySize
                      (this->b_,kMkvPrimaryBChromaticityX,kMkvPrimaryBChromaticityY);
    uVar2 = uVar2 + uVar4;
  }
  if (this->white_point_ != (PrimaryChromaticity *)0x0) {
    uVar4 = PrimaryChromaticity::PrimaryChromaticitySize
                      (this->white_point_,kMkvWhitePointChromaticityX,kMkvWhitePointChromaticityY);
    uVar2 = uVar2 + uVar4;
  }
  return uVar2;
}

Assistant:

uint64_t MasteringMetadata::PayloadSize() const {
  uint64_t size = 0;

  if (luminance_max_ != kValueNotPresent)
    size += EbmlElementSize(libwebm::kMkvLuminanceMax, luminance_max_);
  if (luminance_min_ != kValueNotPresent)
    size += EbmlElementSize(libwebm::kMkvLuminanceMin, luminance_min_);

  if (r_) {
    size += r_->PrimaryChromaticitySize(libwebm::kMkvPrimaryRChromaticityX,
                                        libwebm::kMkvPrimaryRChromaticityY);
  }
  if (g_) {
    size += g_->PrimaryChromaticitySize(libwebm::kMkvPrimaryGChromaticityX,
                                        libwebm::kMkvPrimaryGChromaticityY);
  }
  if (b_) {
    size += b_->PrimaryChromaticitySize(libwebm::kMkvPrimaryBChromaticityX,
                                        libwebm::kMkvPrimaryBChromaticityY);
  }
  if (white_point_) {
    size += white_point_->PrimaryChromaticitySize(
        libwebm::kMkvWhitePointChromaticityX,
        libwebm::kMkvWhitePointChromaticityY);
  }

  return size;
}